

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O0

double nifti_cdf2stat(double p,int code,double p1,double p2,double p3)

{
  pqpair pq_00;
  double dVar1;
  pqpair pq;
  double p3_local;
  double p2_local;
  double p1_local;
  int code_local;
  double p_local;
  
  pq_00.q = 1.0 - p;
  pq_00.p = p;
  dVar1 = pq2stat(pq_00,code,p1,p2,p3);
  return dVar1;
}

Assistant:

double nifti_cdf2stat( double p , int code, double p1,double p2,double p3 )
{
   pqpair pq ;
   pq.p = p ; pq.q = 1.0-p ;
   return pq2stat(pq,code,p1,p2,p3) ;
}